

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O1

bfile_t * bf_create_w(char *filename)

{
  FILE *pFVar1;
  bfile_t *pbVar2;
  uint8_t *puVar3;
  size_t sVar4;
  char *__dest;
  
  pFVar1 = fopen(filename,"wb");
  if (pFVar1 == (FILE *)0x0) {
    pbVar2 = (bfile_t *)0x0;
  }
  else {
    pbVar2 = (bfile_t *)malloc(0x50);
    pbVar2->flags = 0;
    pbVar2->file = (FILE *)0x0;
    pbVar2->size = 0;
    pbVar2->pos = 0;
    pbVar2->ipos = 0;
    pbVar2->filename = (char *)0x0;
    puVar3 = (uint8_t *)malloc(0x1000);
    pbVar2->buffer = puVar3;
    pbVar2->buffer_size = 0x1000;
    pbVar2->progress_cb = (_func_int_float_void_ptr *)0x0;
    pbVar2->progress_data = (void *)0x0;
    pbVar2->file = (FILE *)pFVar1;
    sVar4 = strlen(filename);
    __dest = (char *)malloc(sVar4 + 1);
    pbVar2->filename = __dest;
    strcpy(__dest,filename);
    pbVar2->flags = 0x200;
  }
  return pbVar2;
}

Assistant:

bfile_t *
bf_create_w(
    const char * filename )
{
    FILE * file;
    bfile_t * bfile;

    bfile = NULL;
    file = fopen( filename, "wb" );
    if ( file != NULL ) {
        bfile = create_bfile_t( BFILE_BLOCK_SIZE );
        bfile->file = file;
        bfile->filename = (char *)malloc( strlen( filename ) + 1 );
        assert( bfile->filename );
        strcpy( bfile->filename, filename );
        bfile->flags |= BF_WRITABLE;
    }

    return bfile;
}